

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_rgn_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  uint_fast16_t val;
  int iVar1;
  int iVar2;
  
  val = (ms->parms).sot.tileno;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_putuint8(out,(uint_fast8_t)val);
  }
  else {
    iVar1 = jpc_putuint16(out,val);
  }
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = jpc_putuint8(out,(ms->parms).coc.compparms.csty);
    iVar2 = -1;
    if (iVar1 == 0) {
      iVar1 = jpc_putuint8(out,(ms->parms).coc.compparms.numdlvls);
      iVar2 = -(uint)(iVar1 != 0);
    }
  }
  return iVar2;
}

Assistant:

static int jpc_rgn_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	if (cstate->numcomps <= 256) {
		if (jpc_putuint8(out, rgn->compno)) {
			return -1;
		}
	} else {
		if (jpc_putuint16(out, rgn->compno)) {
			return -1;
		}
	}
	if (jpc_putuint8(out, rgn->roisty) ||
	  jpc_putuint8(out, rgn->roishift)) {
		return -1;
	}
	return 0;
}